

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_AEDR(coda_cdf_product *product_file,int64_t offset,char *name,int32_t scope)

{
  int iVar1;
  int local_58;
  uint local_54;
  int32_t num_elems;
  int32_t num;
  int32_t data_type;
  int32_t attr_num;
  int64_t aedr_next;
  coda_dynamic_type *pcStack_38;
  int32_t record_type;
  coda_dynamic_type *attribute;
  char *pcStack_28;
  int32_t scope_local;
  char *name_local;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  if (offset == 0) {
    product_file_local._4_4_ = 0;
  }
  else {
    attribute._4_4_ = scope;
    pcStack_28 = name;
    name_local = (char *)offset;
    offset_local = (int64_t)product_file;
    iVar1 = read_bytes(product_file->raw_product,offset + 8,4,(void *)((long)&aedr_next + 4));
    if (iVar1 < 0) {
      product_file_local._4_4_ = -1;
    }
    else {
      swap4((void *)((long)&aedr_next + 4));
      if ((aedr_next._4_4_ == 5) || (aedr_next._4_4_ == 9)) {
        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),(int64_t)(name_local + 0xc),8,
                           &data_type);
        if (iVar1 < 0) {
          product_file_local._4_4_ = -1;
        }
        else {
          iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),(int64_t)(name_local + 0x14),4,
                             &num);
          if (iVar1 < 0) {
            product_file_local._4_4_ = -1;
          }
          else {
            iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),(int64_t)(name_local + 0x18),
                               4,&num_elems);
            if (iVar1 < 0) {
              product_file_local._4_4_ = -1;
            }
            else {
              iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                 (int64_t)(name_local + 0x1c),4,&local_54);
              if (iVar1 < 0) {
                product_file_local._4_4_ = -1;
              }
              else {
                iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                   (int64_t)(name_local + 0x20),4,&local_58);
                if (iVar1 < 0) {
                  product_file_local._4_4_ = -1;
                }
                else {
                  swap8(&data_type);
                  swap4(&num);
                  swap4(&num_elems);
                  swap4(&local_54);
                  swap4(&local_58);
                  name_local = name_local + 0x38;
                  if ((_data_type < 0) || (*(long *)(offset_local + 8) <= _data_type)) {
                    coda_set_error(-300,"CDF file has invalid offset for AEDR record");
                    product_file_local._4_4_ = -1;
                  }
                  else if (num < 0) {
                    coda_set_error(-300,"CDF file has invalid attribute number in AEDR record");
                    product_file_local._4_4_ = -1;
                  }
                  else if ((int)local_54 < 0) {
                    coda_set_error(-300,"CDF file has invalid entry number in AEDR record");
                    product_file_local._4_4_ = -1;
                  }
                  else if (local_58 < 0) {
                    coda_set_error(-300,"CDF file has invalid number of entries in AEDR record");
                    product_file_local._4_4_ = -1;
                  }
                  else if (num_elems == 0x20) {
                    coda_set_error(-200,"CDF EPOCH16 data type is not supported");
                    product_file_local._4_4_ = -1;
                  }
                  else {
                    iVar1 = read_attribute((coda_cdf_product *)offset_local,(int64_t)name_local,
                                           num_elems,local_58,&stack0xffffffffffffffc8);
                    if (iVar1 == 0) {
                      if ((aedr_next._4_4_ == 5) && ((attribute._4_4_ & 1) != 0)) {
                        iVar1 = coda_mem_type_add_attribute
                                          (*(coda_mem_type **)(offset_local + 0x18),pcStack_28,
                                           pcStack_38,1);
                        if (iVar1 != 0) {
                          coda_dynamic_type_delete(pcStack_38);
                          return -1;
                        }
                      }
                      else {
                        if (((int)local_54 < 0) ||
                           (*(long *)(*(long *)(offset_local + 0x18) + 0x20) <= (long)(int)local_54)
                           ) {
                          coda_set_error(-300,
                                         "CDF Attribute entry number (%d) is outside range of available variables [0,%ld]"
                                         ,(ulong)local_54,
                                         *(long *)(*(long *)(offset_local + 0x18) + 0x20) + -1);
                          return -1;
                        }
                        if (**(int **)(*(long *)(*(long *)(offset_local + 0x18) + 0x28) +
                                      (long)(int)local_54 * 8) != 0x67) {
                          __assert_fail("((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                        ,0x1cb,
                                        "int read_AEDR(coda_cdf_product *, int64_t, const char *, int32_t)"
                                       );
                        }
                        iVar1 = coda_cdf_variable_add_attribute
                                          (*(coda_cdf_variable **)
                                            (*(long *)(*(long *)(offset_local + 0x18) + 0x28) +
                                            (long)(int)local_54 * 8),pcStack_28,pcStack_38,1);
                        if (iVar1 != 0) {
                          coda_dynamic_type_delete(pcStack_38);
                          return -1;
                        }
                      }
                      iVar1 = read_AEDR((coda_cdf_product *)offset_local,_data_type,pcStack_28,
                                        attribute._4_4_);
                      if (iVar1 == 0) {
                        product_file_local._4_4_ = 0;
                      }
                      else {
                        product_file_local._4_4_ = -1;
                      }
                    }
                    else {
                      product_file_local._4_4_ = -1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for AEDR record",
                       (ulong)aedr_next._4_4_);
        product_file_local._4_4_ = -1;
      }
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_AEDR(coda_cdf_product *product_file, int64_t offset, const char *name, int32_t scope)
{
    coda_dynamic_type *attribute;
    int32_t record_type;
    int64_t aedr_next;
    int32_t attr_num;
    int32_t data_type;
    int32_t num;
    int32_t num_elems;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 5 && record_type != 9)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for AEDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &aedr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &attr_num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num_elems) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&aedr_next);
    swap_int32(&attr_num);
    swap_int32(&data_type);
    swap_int32(&num);
    swap_int32(&num_elems);
#endif
    offset += 56;
    if (aedr_next < 0 || aedr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AEDR record");
        return -1;
    }
    if (attr_num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in AEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid entry number in AEDR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries in AEDR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }

    if (read_attribute(product_file, offset, data_type, num_elems, &attribute) != 0)
    {
        return -1;
    }
    if (record_type == 5 && (scope & 1))
    {
        if (coda_mem_type_add_attribute((coda_mem_type *)product_file->root_type, name, attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }
    else
    {
        if (num < 0 || num >= product_file->root_type->num_fields)
        {
            coda_set_error(CODA_ERROR_PRODUCT,
                           "CDF Attribute entry number (%d) is outside range of available variables " "[0,%ld]", num,
                           product_file->root_type->num_fields - 1);
            return -1;
        }

        assert(((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf);
        if (coda_cdf_variable_add_attribute((coda_cdf_variable *)product_file->root_type->field_type[num], name,
                                            attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }

    if (read_AEDR(product_file, aedr_next, name, scope) != 0)
    {
        return -1;
    }

    return 0;
}